

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_70a26::PedestrianPlugIn::open
          (PedestrianPlugIn *this,char *__file,int __oflag,...)

{
  reference ppPVar1;
  Vec3 VVar2;
  PedestrianPlugIn *in_stack_00000020;
  Pedestrian *firstPedestrian;
  int i;
  vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
  *in_stack_ffffffffffffff78;
  Camera *pCVar3;
  PedestrianPlugIn *in_stack_ffffffffffffffa0;
  float local_58;
  __normal_iterator<(anonymous_namespace)::Pedestrian_**,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
  local_20;
  Pedestrian *local_18;
  int local_c;
  PedestrianPlugIn *local_8;
  
  this->cyclePD = -1;
  local_8 = this;
  nextPD(in_stack_00000020);
  this->population = 0;
  for (local_c = 0; local_c < 1; local_c = local_c + 1) {
    addPedestrianToCrowd(in_stack_ffffffffffffffa0);
  }
  local_20._M_current =
       (Pedestrian **)
       std::
       vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
       ::begin(in_stack_ffffffffffffff78);
  ppPVar1 = __gnu_cxx::
            __normal_iterator<(anonymous_namespace)::Pedestrian_**,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
            ::operator*(&local_20);
  local_18 = *ppPVar1;
  OpenSteer::OpenSteerDemo::init3dCamera((AbstractVehicle *)0x151c99);
  pCVar3 = &OpenSteer::OpenSteerDemo::camera;
  OpenSteer::OpenSteerDemo::camera.mode = cmFixedDistanceOffset;
  OpenSteer::Vec3::set(&OpenSteer::OpenSteerDemo::camera.fixedTarget,15.0,0.0,30.0);
  VVar2 = OpenSteer::Vec3::set(&pCVar3->fixedPosition,15.0,70.0,-70.0);
  local_58 = VVar2.z;
  return (int)local_58;
}

Assistant:

void open (void)
        {
            // make the database used to accelerate proximity queries
            cyclePD = -1;
            nextPD ();

            // create the specified number of Pedestrians
            population = 0;
            for (int i = 0; i < gPedestrianStartCount; i++) addPedestrianToCrowd ();

            // initialize camera and selectedVehicle
            Pedestrian& firstPedestrian = **crowd.begin();
            OpenSteerDemo::init3dCamera (firstPedestrian);
            OpenSteerDemo::camera.mode = Camera::cmFixedDistanceOffset;
            OpenSteerDemo::camera.fixedTarget.set (15, 0, 30);
            OpenSteerDemo::camera.fixedPosition.set (15, 70, -70);
        }